

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sx1231_ods.c
# Opt level: O1

int rf_config(rf_dev_t *dev,float freq_mhz,float fdev_khz,int modulation,double data_rate_kbps)

{
  long lVar1;
  int iVar2;
  uint8_t data;
  int iVar3;
  uint8_t buf [7];
  uint8_t local_1f;
  undefined1 local_1e;
  byte local_1d;
  undefined1 local_1c;
  undefined1 local_1b;
  undefined1 local_1a;
  undefined1 local_19;
  
  lVar1 = (long)((freq_mhz * 1e+06) / 61.035156);
  iVar2 = (int)((fdev_khz * 1000.0) / 61.035156);
  iVar3 = (int)(32000000.0 / (data_rate_kbps * 1000.0));
  local_1f = (uint8_t)((uint)iVar3 >> 8);
  local_1e = (undefined1)iVar3;
  local_1d = (byte)((uint)iVar2 >> 8) & 0x3f;
  local_1c = (undefined1)iVar2;
  local_1b = (undefined1)((ulong)lVar1 >> 0x10);
  local_1a = (undefined1)((ulong)lVar1 >> 8);
  local_19 = (undefined1)lVar1;
  iVar2 = spi_write_regs(dev->fd,'\x03',&local_1f,7);
  if (iVar2 == 0) {
    if (modulation == 1) {
      data = '\b';
    }
    else {
      data = '\0';
    }
    iVar2 = spi_write_reg(dev->fd,'\x02',data);
    if (iVar2 == 0) {
      iVar2 = spi_write_reg(dev->fd,'&','\a');
      if (iVar2 == 0) {
        iVar2 = spi_write_reg(dev->fd,',','\0');
        if (iVar2 == 0) {
          iVar2 = spi_write_reg(dev->fd,'-','\0');
          if (iVar2 == 0) {
            iVar2 = spi_write_reg(dev->fd,'.','\x18');
            if (iVar2 == 0) {
              iVar2 = spi_write_reg(dev->fd,'7','\0');
              if (iVar2 == 0) {
                iVar2 = spi_write_reg(dev->fd,'8','\0');
                if (iVar2 == 0) {
                  iVar2 = spi_write_reg(dev->fd,'<',0x8f);
                  if (iVar2 == 0) {
                    iVar2 = spi_write_reg(dev->fd,'\x11','_');
                    if (iVar2 == 0) {
                      iVar2 = _switch_mode(dev,4);
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return iVar2;
}

Assistant:

int rf_config(rf_dev_t *dev,
		float freq_mhz, float fdev_khz,
		int modulation, double data_rate_kbps)
{
	int err = ERR_UNSPEC;

	// reset
	TRY(_reset(dev));

	// Program frequency configuration
	// TODO: range validation...
	uint32_t reg_freq = ((freq_mhz * 1e6) / SX1231_FSTEP);
	uint16_t reg_fdev = ((fdev_khz * 1e3) / SX1231_FSTEP);
	uint16_t reg_bitrate = SX1231_FXOSC / (data_rate_kbps * 1000);
	uint8_t buf[7];

	buf[0] = reg_bitrate >> 8;
	buf[1] = reg_bitrate;
	buf[2] = (reg_fdev >> 8) & 0x3f;
	buf[3] = reg_fdev;
	buf[4] = reg_freq >> 16;
	buf[5] = reg_freq >> 8;
	buf[6] = reg_freq;
	TRY(spi_write_regs(dev->fd, RegBitrateMsb, buf, 2 + 2 + 3));

	// Set modulation
	if (modulation == SX1231_MODULATION_OOK) {
		TRY(spi_write_reg(dev->fd, RegDataModul, 0x08));
	} else {
		TRY(spi_write_reg(dev->fd, RegDataModul, 0x00));
	}

	// Disable CLKOUT
	TRY(spi_write_reg(dev->fd, RegDioMapping2, 0x07));

	// Disable Preamble
	TRY(spi_write_reg(dev->fd, RegPreambleMsb, 0x00));
	TRY(spi_write_reg(dev->fd, RegPreambleLsb, 0x00));

	// Disable sync word
	TRY(spi_write_reg(dev->fd, RegSyncConfig, 0x18));

	// Set to unlimited packet mode
	// crcOn=false, dcFree=none, AddrFilt=none
	TRY(spi_write_reg(dev->fd, RegPacketConfig1, 0x00));
	TRY(spi_write_reg(dev->fd, RegPayloadLength, 0x00));

	// Start TX if FifoNotEmpty
	TRY(spi_write_reg(dev->fd, RegFifoThresh, 0x8f));

	// Configure PA
#ifdef WITH_PA1_DEFAULT
	TRY(rf_set_pa(dev, 0x1f, true));
#else
	TRY(rf_set_pa(dev, 0x1f, false));
#endif

	// TODO: generic: modulation shaping
	// TODO: transmitter: paRamp, over-current(OCP)
	// TODO: test: TcxoInputOn


	// Switch to standby mode
	TRY(_switch_mode(dev, OP_MODE_MODE_STDBY));

	err = ERR_OK;
fail:
	return err;
}